

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O3

MPP_RET __thiscall Mpp::control_dec(Mpp *this,MpiCmd cmd,MppParam param)

{
  pthread_mutex_t *__mutex;
  MPP_RET MVar1;
  RK_S32 RVar2;
  undefined8 in_RAX;
  MppDec ctx;
  MppBufferGroupImpl *p;
  undefined4 uVar3;
  
  MVar1 = MPP_NOK;
  if ((int)cmd < 0x310101) {
    switch(cmd) {
    case MPP_DEC_SET_FRAME_INFO:
    case MPP_DEC_GET_VPUMEM_USED_COUNT:
    case MPP_DEC_SET_OUTPUT_FORMAT:
    case MPP_DEC_SET_MAX_USE_BUFFER_SIZE:
    case MPP_DEC_GET_THUMBNAIL_FRAME_INFO:
      goto switchD_001396a6_caseD_310001;
    case MPP_DEC_SET_EXT_BUF_GROUP:
      if (this->mInitDone == 0) {
        _mpp_log_l(2,"mpp","WARNING: setup buffer group before decoder init\n",(char *)0x0);
        return MPP_NOK;
      }
      p = (MppBufferGroupImpl *)this->mFrameGroup;
      uVar3 = (undefined4)((ulong)in_RAX >> 0x20);
      if (param == (MppParam)0x0) {
        if (this->mExternalBufferMode == 0) {
          if (p != (MppBufferGroupImpl *)0x0) {
            mpp_buffer_group_clear(p);
          }
        }
        else {
          if (p == (MppBufferGroupImpl *)0x0) {
            _mpp_log_l(2,"mpp","Assertion %s failed at %s:%d\n",(char *)0x0,"mFrameGroup",
                       "control_dec",CONCAT44(uVar3,0x4fb));
            if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_001399d6:
              abort();
            }
            p = (MppBufferGroupImpl *)this->mFrameGroup;
          }
          mpp_buffer_group_set_callback(p,(MppBufCallback)0x0,(void *)0x0);
          this->mFrameGroup = (MppBufferGroup)0x0;
        }
        if (((byte)mpp_debug & 4) != 0) {
          _mpp_log_l(4,"mpp","using internal buffer group %p\n",(char *)0x0,this->mFrameGroup);
        }
        this->mExternalBufferMode = 0;
      }
      else {
        if (this->mExternalBufferMode == 0) {
          if (p != (MppBufferGroupImpl *)0x0) {
            mpp_buffer_group_put(p);
          }
        }
        else if (p != (MppBufferGroupImpl *)param) {
          if (p == (MppBufferGroupImpl *)0x0) {
            _mpp_log_l(2,"mpp","Assertion %s failed at %s:%d\n",(char *)0x0,"mFrameGroup",
                       "control_dec",CONCAT44(uVar3,0x50d));
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001399d6;
            p = (MppBufferGroupImpl *)this->mFrameGroup;
          }
          mpp_buffer_group_set_callback(p,(MppBufCallback)0x0,(void *)0x0);
        }
        if (((byte)mpp_debug & 4) != 0) {
          _mpp_log_l(4,"mpp","using external buffer group %p\n",(char *)0x0,this->mFrameGroup);
        }
        this->mFrameGroup = param;
        mpp_buffer_group_set_callback((MppBufferGroupImpl *)param,mpp_notify_by_buffer_group,this);
        this->mExternalBufferMode = 1;
        notify(this,0x10);
      }
      break;
    case MPP_DEC_SET_INFO_CHANGE_READY:
      if (((byte)mpp_debug & 4) != 0) {
        _mpp_log_l(4,"mpp","set info change ready\n",(char *)0x0);
      }
      MVar1 = mpp_dec_control(this->mDec,MPP_DEC_SET_INFO_CHANGE_READY,param);
      notify(this,0x420);
      return MVar1;
    case MPP_DEC_SET_PRESENT_TIME_ORDER:
    case MPP_DEC_SET_PARSER_SPLIT_MODE:
    case MPP_DEC_SET_PARSER_FAST_MODE:
    case MPP_DEC_SET_DISABLE_ERROR:
    case MPP_DEC_SET_IMMEDIATE_OUT:
    case MPP_DEC_SET_ENABLE_DEINTERLACE:
    case MPP_DEC_SET_ENABLE_FAST_PLAY:
    case MPP_DEC_SET_ENABLE_MVC:
    case MPP_DEC_SET_DISABLE_DPB_CHECK:
    case MPP_DEC_SET_CODEC_MODE:
    case MPP_DEC_SET_DIS_ERR_CLR_MARK:
      ctx = this->mDec;
      if (ctx == (MppDec)0x0) {
        MVar1 = mpp_dec_set_cfg_by_cmd(&this->mDecInitcfg,cmd,param);
        return MVar1;
      }
      goto LAB_0013970e;
    case MPP_DEC_GET_STREAM_COUNT:
      __mutex = (pthread_mutex_t *)this->mPktIn;
      if (__mutex == (pthread_mutex_t *)0x0) {
        RVar2 = mpp_list::list_size((mpp_list *)0x0);
        *(RK_S32 *)param = RVar2;
        return MPP_OK;
      }
      pthread_mutex_lock(__mutex);
      RVar2 = mpp_list::list_size(this->mPktIn);
      *(RK_S32 *)param = RVar2;
      pthread_mutex_unlock(__mutex);
      break;
    default:
      goto switchD_001396a6_caseD_310009;
    }
LAB_001399c5:
    MVar1 = MPP_OK;
switchD_001396a6_caseD_310009:
    return MVar1;
  }
  if (cmd != MPP_DEC_QUERY) {
    if (cmd == MPP_DEC_SET_CFG) {
      ctx = this->mDec;
      if (ctx == (MppDec)0x0) {
        if (param == (MppParam)0x0) {
          return MPP_NOK;
        }
        MVar1 = mpp_dec_set_cfg(&this->mDecInitcfg,(MppDecCfgSet *)((long)param + 8));
        return MVar1;
      }
      cmd = MPP_DEC_SET_CFG;
      goto LAB_0013970e;
    }
    if (cmd != MPP_DEC_GET_CFG) {
      return MPP_NOK;
    }
    ctx = this->mDec;
    if (ctx != (MppDec)0x0) {
      cmd = MPP_DEC_GET_CFG;
      goto LAB_0013970e;
    }
    if (param == (MppParam)0x0) {
      return MPP_NOK;
    }
    memcpy((void *)((long)param + 8),&this->mDecInitcfg,0xa0);
    goto LAB_001399c5;
  }
switchD_001396a6_caseD_310001:
  ctx = this->mDec;
LAB_0013970e:
  MVar1 = mpp_dec_control(ctx,cmd,param);
  return MVar1;
}

Assistant:

MPP_RET Mpp::control_dec(MpiCmd cmd, MppParam param)
{
    MPP_RET ret = MPP_NOK;

    switch (cmd) {
    case MPP_DEC_GET_THUMBNAIL_FRAME_INFO:
    case MPP_DEC_SET_FRAME_INFO: {
        ret = mpp_dec_control(mDec, cmd, param);
    } break;
    case MPP_DEC_SET_EXT_BUF_GROUP: {
        /*
         * NOTE: If frame buffer group is configured before decoder init
         * then the buffer limitation maybe not be correctly setup
         * without infomation from InfoChange frame.
         * And the thread signal connection may not be setup here. It
         * may have a bad effect on MPP efficiency.
         */
        if (!mInitDone) {
            mpp_err("WARNING: setup buffer group before decoder init\n");
            break;
        }

        ret = MPP_OK;
        if (!param) {
            /* set to internal mode */
            if (mExternalBufferMode) {
                /* switch from external mode to internal mode */
                mpp_assert(mFrameGroup);
                mpp_buffer_group_set_callback((MppBufferGroupImpl *)mFrameGroup,
                                              NULL, NULL);
                mFrameGroup = NULL;
            } else {
                /* keep internal buffer mode cleanup old buffers */
                if (mFrameGroup)
                    mpp_buffer_group_clear(mFrameGroup);
            }

            mpp_dbg_info("using internal buffer group %p\n", mFrameGroup);
            mExternalBufferMode = 0;
        } else {
            /* set to external mode */
            if (mExternalBufferMode) {
                /* keep external buffer mode */
                if (mFrameGroup != param) {
                    /* switch to new buffer group */
                    mpp_assert(mFrameGroup);
                    mpp_buffer_group_set_callback((MppBufferGroupImpl *)mFrameGroup,
                                                  NULL, NULL);
                } else {
                    /* keep old group the external group user should cleanup its old buffers */
                }
            } else {
                /* switch from intenal mode to external mode */
                if (mFrameGroup)
                    mpp_buffer_group_put(mFrameGroup);
            }

            mpp_dbg_info("using external buffer group %p\n", mFrameGroup);

            mFrameGroup = (MppBufferGroup)param;
            mpp_buffer_group_set_callback((MppBufferGroupImpl *)mFrameGroup,
                                          mpp_notify_by_buffer_group, (void *)this);
            mExternalBufferMode = 1;
            notify(MPP_DEC_NOTIFY_EXT_BUF_GRP_READY);
        }
    } break;
    case MPP_DEC_SET_INFO_CHANGE_READY: {
        mpp_dbg_info("set info change ready\n");

        ret = mpp_dec_control(mDec, cmd, param);
        notify(MPP_DEC_NOTIFY_INFO_CHG_DONE | MPP_DEC_NOTIFY_BUFFER_MATCH);
    } break;
    case MPP_DEC_SET_PRESENT_TIME_ORDER :
    case MPP_DEC_SET_PARSER_SPLIT_MODE :
    case MPP_DEC_SET_PARSER_FAST_MODE :
    case MPP_DEC_SET_IMMEDIATE_OUT :
    case MPP_DEC_SET_DISABLE_ERROR :
    case MPP_DEC_SET_DIS_ERR_CLR_MARK :
    case MPP_DEC_SET_ENABLE_DEINTERLACE :
    case MPP_DEC_SET_ENABLE_FAST_PLAY :
    case MPP_DEC_SET_ENABLE_MVC :
    case MPP_DEC_SET_DISABLE_DPB_CHECK :
    case MPP_DEC_SET_CODEC_MODE : {
        /*
         * These control may be set before mpp_init
         * When this case happen record the config and wait for decoder init
         */
        if (mDec) {
            ret = mpp_dec_control(mDec, cmd, param);
            return ret;
        }

        ret = mpp_dec_set_cfg_by_cmd(&mDecInitcfg, cmd, param);
    } break;
    case MPP_DEC_GET_STREAM_COUNT: {
        AutoMutex autoLock(mPktIn->mutex());
        *((RK_S32 *)param) = mPktIn->list_size();
        ret = MPP_OK;
    } break;
    case MPP_DEC_GET_VPUMEM_USED_COUNT :
    case MPP_DEC_SET_OUTPUT_FORMAT :
    case MPP_DEC_QUERY :
    case MPP_DEC_SET_MAX_USE_BUFFER_SIZE: {
        ret = mpp_dec_control(mDec, cmd, param);
    } break;
    case MPP_DEC_SET_CFG : {
        if (mDec)
            ret = mpp_dec_control(mDec, cmd, param);
        else if (param) {
            MppDecCfgImpl *dec_cfg = (MppDecCfgImpl *)param;

            ret = mpp_dec_set_cfg(&mDecInitcfg, &dec_cfg->cfg);
        }
    } break;
    case MPP_DEC_GET_CFG : {
        if (mDec)
            ret = mpp_dec_control(mDec, cmd, param);
        else if (param) {
            MppDecCfgImpl *dec_cfg = (MppDecCfgImpl *)param;

            memcpy(&dec_cfg->cfg, &mDecInitcfg, sizeof(dec_cfg->cfg));
            ret = MPP_OK;
        }
    } break;
    default : {
    } break;
    }
    return ret;
}